

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar3;
  uint uVar4;
  double *pdVar5;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar6
  ;
  ulong uVar7;
  value_type vVar8;
  
  pFVar6 = (fadexpr->fadexpr_).left_;
  uVar4 = (((((pFVar6->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  uVar1 = (((pFVar6->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar2 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 <= (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_013fd275;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_013fd275;
    }
    if (uVar2 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar6 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar7 = (ulong)uVar1 << 3;
    }
    pdVar5 = (double *)operator_new__(uVar7);
    (this->dx_).ptr_to_data = pdVar5;
    uVar4 = (((((pFVar6->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  }
  if (((uVar4 == 0) || ((((pFVar6->fadexpr_).right_)->dx_).num_elts == 0)) ||
     ((((fadexpr->fadexpr_).right_)->dx_).num_elts == 0)) {
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        vVar8 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
                ::dx(&fadexpr->fadexpr_,(int)uVar7);
        pdVar5[uVar7] = vVar8;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
  }
  else if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      vVar8 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
              ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar7);
      pdVar5[uVar7] = vVar8;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
LAB_013fd275:
  pFVar6 = (fadexpr->fadexpr_).left_;
  pFVar3 = (pFVar6->fadexpr_).left_;
  this->val_ = ((pFVar3->fadexpr_).left_.constant_ * ((pFVar3->fadexpr_).right_)->val_ *
               ((pFVar6->fadexpr_).right_)->val_) / ((fadexpr->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}